

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope_test.cpp
# Opt level: O0

void __thiscall
reflect_scope_test_DefaultConstructor_Test::TestBody
          (reflect_scope_test_DefaultConstructor_Test *this)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  AssertionResult gtest_ar_25;
  char *str;
  memory_allocator allocator;
  AssertionResult gtest_ar_24;
  value v;
  size_t size;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  function_impl_example example_empty_impl;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  function_impl_example example_empty_ret_impl;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  function_impl_example example_duck_mix_ret_impl;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  function_impl_example example_duck_mix_impl;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  function_impl_example example_duck_ret_impl;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  function_impl_example example_duck_impl;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  function_impl_example example_ret_impl;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  function_impl_example example_asd_impl;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  function_impl_example example_impl;
  function f9;
  function f8;
  function f7;
  function f6;
  function f5;
  function f4;
  function f3;
  function f2;
  function f1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  type ptr_type;
  type int_type;
  type char_type;
  AssertionResult gtest_ar_2;
  scope sp;
  serial s;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  type_type **in_stack_fffffffffffff740;
  type_type **in_stack_fffffffffffff748;
  char *in_stack_fffffffffffff750;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff758;
  undefined1 in_stack_fffffffffffff75f;
  AssertHelper local_570;
  Message local_568;
  undefined4 local_560;
  undefined4 local_55c;
  AssertionResult local_558;
  undefined8 local_548;
  undefined8 local_540;
  AssertHelper local_538;
  Message local_530;
  undefined8 local_528;
  undefined8 local_520;
  AssertionResult local_518;
  undefined8 local_508;
  undefined8 local_500;
  AssertHelper local_4f8;
  Message local_4f0;
  undefined4 local_4e8;
  undefined4 local_4e4;
  AssertionResult local_4e0;
  AssertHelper local_4d0;
  Message local_4c8;
  undefined8 local_4c0;
  long local_4b8;
  AssertionResult local_4b0;
  void *local_4a0;
  AssertHelper local_498;
  Message local_490;
  undefined4 local_488;
  undefined4 local_484;
  AssertionResult local_480;
  AssertHelper local_470;
  Message local_468;
  undefined8 local_460;
  long local_458;
  AssertionResult local_450;
  void *local_440;
  AssertHelper local_438;
  Message local_430;
  undefined4 local_428;
  undefined4 local_424;
  AssertionResult local_420;
  AssertHelper local_410;
  Message local_408;
  undefined8 local_400;
  long local_3f8;
  AssertionResult local_3f0;
  void *local_3e0;
  AssertHelper local_3d8;
  Message local_3d0;
  undefined4 local_3c8;
  undefined4 local_3c4;
  AssertionResult local_3c0;
  AssertHelper local_3b0;
  Message local_3a8;
  undefined8 local_3a0;
  long local_398;
  AssertionResult local_390;
  void *local_380;
  AssertHelper local_378;
  Message local_370;
  undefined4 local_368;
  undefined4 local_364;
  AssertionResult local_360;
  AssertHelper local_350;
  Message local_348;
  undefined8 local_340;
  long local_338;
  AssertionResult local_330;
  void *local_320;
  AssertHelper local_318;
  Message local_310;
  undefined4 local_308;
  undefined4 local_304;
  AssertionResult local_300;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined8 local_2e0;
  long local_2d8;
  AssertionResult local_2d0;
  void *local_2c0;
  AssertHelper local_2b8;
  Message local_2b0;
  undefined4 local_2a8;
  undefined4 local_2a4;
  AssertionResult local_2a0;
  AssertHelper local_290;
  Message local_288;
  undefined8 local_280;
  long local_278;
  AssertionResult local_270;
  void *local_260;
  AssertHelper local_258;
  Message local_250;
  undefined4 local_248;
  undefined4 local_244;
  AssertionResult local_240;
  AssertHelper local_230;
  Message local_228;
  undefined8 local_220;
  long local_218;
  AssertionResult local_210;
  void *local_200;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined4 local_1e8;
  undefined4 local_1e4;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined8 local_1c0;
  long local_1b8;
  AssertionResult local_1b0;
  void *local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  AssertHelper local_150;
  Message local_148;
  undefined8 local_140;
  long local_138;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined8 local_110;
  long local_108;
  AssertionResult local_100;
  AssertHelper local_f0;
  Message local_e8;
  undefined8 local_e0;
  long local_d8;
  AssertionResult local_d0;
  long local_c0;
  long local_b8;
  long local_b0;
  AssertHelper local_a8;
  Message local_a0;
  undefined8 local_98;
  long local_90;
  AssertionResult local_88;
  long local_78;
  undefined8 local_70;
  AssertHelper local_68;
  Message local_60;
  undefined4 local_58;
  undefined4 local_54;
  AssertionResult local_50;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  uVar3 = log_policy_format_text();
  uVar4 = log_policy_schedule_sync();
  uVar5 = log_policy_storage_sequential();
  uVar6 = log_policy_stream_stdio(_stdout);
  local_20 = log_configure_impl("metacall",4,uVar3,uVar4,uVar5,uVar6);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
             in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748,
             (int *)in_stack_fffffffffffff740);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar2) {
    testing::Message::Message(local_38);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10bd55);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x82,pcVar7);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10bdb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10be0d);
  local_54 = 0;
  local_58 = serial_initialize();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
             in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748,
             (int *)in_stack_fffffffffffff740);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  if (!bVar2) {
    testing::Message::Message(&local_60);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10bec6);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x85,pcVar7);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message((Message *)0x10bf29);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bf81);
  local_70 = serial_create("rapid_json");
  local_90 = scope_create("test");
  local_98 = 0;
  local_78 = local_90;
  testing::internal::CmpHelperNE<scope_type*,scope_type*>
            ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
             in_stack_fffffffffffff750,(scope_type **)in_stack_fffffffffffff748,
             (scope_type **)in_stack_fffffffffffff740);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar2) {
    testing::Message::Message(&local_a0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c067);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x8c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message((Message *)0x10c0ca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c122);
  local_b0 = type_create(1,"char",0);
  local_b8 = type_create(3,"int",0);
  local_c0 = type_create(0xb,"ptr",0);
  local_d8 = local_b0;
  local_e0 = 0;
  testing::internal::CmpHelperNE<type_type*,type_type*>
            ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
             in_stack_fffffffffffff750,in_stack_fffffffffffff748,in_stack_fffffffffffff740);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
  if (!bVar2) {
    testing::Message::Message(&local_e8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c250);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x92,pcVar7);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message((Message *)0x10c2b3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c30b);
  local_108 = local_b8;
  local_110 = 0;
  testing::internal::CmpHelperNE<type_type*,type_type*>
            ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
             in_stack_fffffffffffff750,in_stack_fffffffffffff748,in_stack_fffffffffffff740);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c3c9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x93,pcVar7);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x10c42c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c484);
  local_138 = local_c0;
  local_140 = 0;
  testing::internal::CmpHelperNE<type_type*,type_type*>
            ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
             in_stack_fffffffffffff750,in_stack_fffffffffffff748,in_stack_fffffffffffff740);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_130);
  if (!bVar2) {
    testing::Message::Message(&local_148);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c542);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x94,pcVar7);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message((Message *)0x10c5a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c5fd);
  if ((((local_78 != 0) && (local_b0 != 0)) && (local_b8 != 0)) && (local_c0 != 0)) {
    local_1a0 = malloc(8);
    local_1b8 = function_create("example",3,local_1a0,function_example_singleton);
    local_1c0 = 0;
    local_158 = local_1b8;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
               in_stack_fffffffffffff750,(function_type **)in_stack_fffffffffffff748,
               (function_type **)in_stack_fffffffffffff740);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
    if (!bVar2) {
      testing::Message::Message(&local_1c8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c731);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0x9e,pcVar7);
      testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      testing::Message::~Message((Message *)0x10c794);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c7ec);
    if (local_158 != 0) {
      uVar3 = function_signature(local_158);
      signature_set(uVar3,0,"c",local_b0);
      uVar3 = function_signature(local_158);
      signature_set(uVar3,1,"i",local_b8);
      uVar3 = function_signature(local_158);
      signature_set(uVar3,2,"p",local_c0);
      lVar1 = local_78;
      uVar3 = function_name(local_158);
      uVar4 = value_create_function(local_158);
      local_1e4 = scope_define(lVar1,uVar3,uVar4);
      local_1e8 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
                 in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748,
                 (int *)in_stack_fffffffffffff740);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
      if (!bVar2) {
        testing::Message::Message(&local_1f0);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c973);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xa6,pcVar7);
        testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
        testing::internal::AssertHelper::~AssertHelper(&local_1f8);
        testing::Message::~Message((Message *)0x10c9d6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ca2b);
    }
    local_200 = malloc(8);
    local_218 = function_create("example_asd",3,local_200,function_example_singleton);
    local_220 = 0;
    local_160 = local_218;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
               in_stack_fffffffffffff750,(function_type **)in_stack_fffffffffffff748,
               (function_type **)in_stack_fffffffffffff740);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar2) {
      testing::Message::Message(&local_228);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10cb25);
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xad,pcVar7);
      testing::internal::AssertHelper::operator=(&local_230,&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      testing::Message::~Message((Message *)0x10cb88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cbe0);
    if (local_160 != 0) {
      uVar3 = function_signature(local_160);
      signature_set(uVar3,0,"e",local_b0);
      uVar3 = function_signature(local_160);
      signature_set(uVar3,1,"o",local_b8);
      uVar3 = function_signature(local_160);
      signature_set(uVar3,2,"u",local_c0);
      lVar1 = local_78;
      uVar3 = function_name(local_160);
      uVar4 = value_create_function(local_160);
      local_244 = scope_define(lVar1,uVar3,uVar4);
      local_248 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
                 in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748,
                 (int *)in_stack_fffffffffffff740);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_240);
      if (!bVar2) {
        testing::Message::Message(&local_250);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10cd67);
        testing::internal::AssertHelper::AssertHelper
                  (&local_258,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xb5,pcVar7);
        testing::internal::AssertHelper::operator=(&local_258,&local_250);
        testing::internal::AssertHelper::~AssertHelper(&local_258);
        testing::Message::~Message((Message *)0x10cdca);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ce1f);
    }
    local_260 = malloc(8);
    local_278 = function_create("example_ret",3,local_260,function_example_singleton);
    local_280 = 0;
    local_168 = local_278;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
               in_stack_fffffffffffff750,(function_type **)in_stack_fffffffffffff748,
               (function_type **)in_stack_fffffffffffff740);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_270);
    if (!bVar2) {
      testing::Message::Message(&local_288);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10cf19);
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xbc,pcVar7);
      testing::internal::AssertHelper::operator=(&local_290,&local_288);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      testing::Message::~Message((Message *)0x10cf7c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cfd4);
    if (local_168 != 0) {
      uVar3 = function_signature(local_168);
      signature_set_return(uVar3,local_b8);
      uVar3 = function_signature(local_168);
      signature_set(uVar3,0,"e",local_b0);
      uVar3 = function_signature(local_168);
      signature_set(uVar3,1,"o",local_b8);
      uVar3 = function_signature(local_168);
      signature_set(uVar3,2,"u",local_c0);
      lVar1 = local_78;
      uVar3 = function_name(local_168);
      uVar4 = value_create_function(local_168);
      local_2a4 = scope_define(lVar1,uVar3,uVar4);
      local_2a8 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
                 in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748,
                 (int *)in_stack_fffffffffffff740);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
      if (!bVar2) {
        testing::Message::Message(&local_2b0);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d178);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xc5,pcVar7);
        testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_2b8);
        testing::Message::~Message((Message *)0x10d1db);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d230);
    }
    local_2c0 = malloc(8);
    local_2d8 = function_create("example_duck",3,local_2c0,function_example_singleton);
    local_2e0 = 0;
    local_170 = local_2d8;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
               in_stack_fffffffffffff750,(function_type **)in_stack_fffffffffffff748,
               (function_type **)in_stack_fffffffffffff740);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
    if (!bVar2) {
      testing::Message::Message(&local_2e8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d32a);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xcc,pcVar7);
      testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
      testing::internal::AssertHelper::~AssertHelper(&local_2f0);
      testing::Message::~Message((Message *)0x10d38d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d3e5);
    if (local_170 != 0) {
      uVar3 = function_signature(local_170);
      signature_set(uVar3,0,"e");
      uVar3 = function_signature(local_170);
      signature_set(uVar3,1,"o",0);
      uVar3 = function_signature(local_170);
      signature_set(uVar3,2,"u",0);
      lVar1 = local_78;
      uVar3 = function_name(local_170);
      uVar4 = value_create_function(local_170);
      local_304 = scope_define(lVar1,uVar3,uVar4);
      local_308 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
                 in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748,
                 (int *)in_stack_fffffffffffff740);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_300);
      if (!bVar2) {
        testing::Message::Message(&local_310);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d56f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_318,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xd4,pcVar7);
        testing::internal::AssertHelper::operator=(&local_318,&local_310);
        testing::internal::AssertHelper::~AssertHelper(&local_318);
        testing::Message::~Message((Message *)0x10d5d2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d627);
    }
    local_320 = malloc(8);
    local_338 = function_create("example_duck_ret",3,local_320,function_example_singleton);
    local_340 = 0;
    local_178 = local_338;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
               in_stack_fffffffffffff750,(function_type **)in_stack_fffffffffffff748,
               (function_type **)in_stack_fffffffffffff740);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_330);
    if (!bVar2) {
      testing::Message::Message(&local_348);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d721);
      testing::internal::AssertHelper::AssertHelper
                (&local_350,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xdb,pcVar7);
      testing::internal::AssertHelper::operator=(&local_350,&local_348);
      testing::internal::AssertHelper::~AssertHelper(&local_350);
      testing::Message::~Message((Message *)0x10d784);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d7dc);
    if (local_178 != 0) {
      uVar3 = function_signature(local_178);
      signature_set_return(uVar3,local_b8);
      uVar3 = function_signature(local_178);
      signature_set(uVar3,0,"asdfe");
      uVar3 = function_signature(local_178);
      signature_set(uVar3,1,"do",0);
      uVar3 = function_signature(local_178);
      signature_set(uVar3,2,"dafu",0);
      lVar1 = local_78;
      uVar3 = function_name(local_178);
      uVar4 = value_create_function(local_178);
      local_364 = scope_define(lVar1,uVar3,uVar4);
      local_368 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
                 in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748,
                 (int *)in_stack_fffffffffffff740);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_360);
      if (!bVar2) {
        testing::Message::Message(&local_370);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d983);
        testing::internal::AssertHelper::AssertHelper
                  (&local_378,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xe4,pcVar7);
        testing::internal::AssertHelper::operator=(&local_378,&local_370);
        testing::internal::AssertHelper::~AssertHelper(&local_378);
        testing::Message::~Message((Message *)0x10d9e6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10da3b);
    }
    local_380 = malloc(8);
    local_398 = function_create("example_duck_mix",4,local_380,function_example_singleton);
    local_3a0 = 0;
    local_180 = local_398;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
               in_stack_fffffffffffff750,(function_type **)in_stack_fffffffffffff748,
               (function_type **)in_stack_fffffffffffff740);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_390);
    if (!bVar2) {
      testing::Message::Message(&local_3a8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10db35);
      testing::internal::AssertHelper::AssertHelper
                (&local_3b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xeb,pcVar7);
      testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
      testing::internal::AssertHelper::~AssertHelper(&local_3b0);
      testing::Message::~Message((Message *)0x10db98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dbf0);
    if (local_180 != 0) {
      uVar3 = function_signature(local_180);
      signature_set(uVar3,0,"asdfe");
      uVar3 = function_signature(local_180);
      signature_set(uVar3,1,"do",local_b8);
      uVar3 = function_signature(local_180);
      signature_set(uVar3,2,"dafu",0);
      uVar3 = function_signature(local_180);
      signature_set(uVar3,3,"dafu",local_c0);
      lVar1 = local_78;
      uVar3 = function_name(local_180);
      uVar4 = value_create_function(local_180);
      local_3c4 = scope_define(lVar1,uVar3,uVar4);
      local_3c8 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
                 in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748,
                 (int *)in_stack_fffffffffffff740);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
      if (!bVar2) {
        testing::Message::Message(&local_3d0);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10ddac);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xf4,pcVar7);
        testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
        testing::internal::AssertHelper::~AssertHelper(&local_3d8);
        testing::Message::~Message((Message *)0x10de0f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10de64);
    }
    local_3e0 = malloc(8);
    local_3f8 = function_create("example_duck_mix_ret",4,local_3e0,function_example_singleton);
    local_400 = 0;
    local_188 = local_3f8;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
               in_stack_fffffffffffff750,(function_type **)in_stack_fffffffffffff748,
               (function_type **)in_stack_fffffffffffff740);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
    if (!bVar2) {
      testing::Message::Message(&local_408);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10df5e);
      testing::internal::AssertHelper::AssertHelper
                (&local_410,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xfb,pcVar7);
      testing::internal::AssertHelper::operator=(&local_410,&local_408);
      testing::internal::AssertHelper::~AssertHelper(&local_410);
      testing::Message::~Message((Message *)0x10dfc1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e019);
    if (local_188 != 0) {
      uVar3 = function_signature(local_188);
      signature_set_return(uVar3,local_b8);
      uVar3 = function_signature(local_188);
      signature_set(uVar3,0,"asdfe",local_b8);
      uVar3 = function_signature(local_188);
      signature_set(uVar3,1,"do",0);
      uVar3 = function_signature(local_188);
      signature_set(uVar3,2,"dafu",local_c0);
      uVar3 = function_signature(local_188);
      signature_set(uVar3,3,"dafufs",0);
      lVar1 = local_78;
      uVar3 = function_name(local_188);
      uVar4 = value_create_function(local_188);
      local_424 = scope_define(lVar1,uVar3,uVar4);
      local_428 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
                 in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748,
                 (int *)in_stack_fffffffffffff740);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_420);
      if (!bVar2) {
        testing::Message::Message(&local_430);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e1ee);
        testing::internal::AssertHelper::AssertHelper
                  (&local_438,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0x105,pcVar7);
        testing::internal::AssertHelper::operator=(&local_438,&local_430);
        testing::internal::AssertHelper::~AssertHelper(&local_438);
        testing::Message::~Message((Message *)0x10e251);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e2a6);
    }
    local_440 = malloc(8);
    local_458 = function_create("example_empty_ret",0,local_440,function_example_singleton);
    local_460 = 0;
    local_190 = local_458;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
               in_stack_fffffffffffff750,(function_type **)in_stack_fffffffffffff748,
               (function_type **)in_stack_fffffffffffff740);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_450);
    if (!bVar2) {
      testing::Message::Message(&local_468);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e39f);
      testing::internal::AssertHelper::AssertHelper
                (&local_470,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0x10c,pcVar7);
      testing::internal::AssertHelper::operator=(&local_470,&local_468);
      testing::internal::AssertHelper::~AssertHelper(&local_470);
      testing::Message::~Message((Message *)0x10e402);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e45a);
    if (local_190 != 0) {
      uVar3 = function_signature(local_190);
      signature_set_return(uVar3,local_b8);
      lVar1 = local_78;
      uVar3 = function_name(local_190);
      uVar4 = value_create_function(local_190);
      local_484 = scope_define(lVar1,uVar3,uVar4);
      local_488 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
                 in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748,
                 (int *)in_stack_fffffffffffff740);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_480);
      if (!bVar2) {
        testing::Message::Message(&local_490);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e584);
        testing::internal::AssertHelper::AssertHelper
                  (&local_498,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0x112,pcVar7);
        testing::internal::AssertHelper::operator=(&local_498,&local_490);
        testing::internal::AssertHelper::~AssertHelper(&local_498);
        testing::Message::~Message((Message *)0x10e5e7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e63c);
    }
    local_4a0 = malloc(8);
    local_4b8 = function_create("example_empty",0,local_4a0,function_example_singleton);
    local_4c0 = 0;
    local_198 = local_4b8;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
               in_stack_fffffffffffff750,(function_type **)in_stack_fffffffffffff748,
               (function_type **)in_stack_fffffffffffff740);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4b0);
    if (!bVar2) {
      testing::Message::Message(&local_4c8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e729);
      testing::internal::AssertHelper::AssertHelper
                (&local_4d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0x119,pcVar7);
      testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
      testing::internal::AssertHelper::~AssertHelper(&local_4d0);
      testing::Message::~Message((Message *)0x10e786);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e7de);
    lVar1 = local_78;
    if (local_198 != 0) {
      uVar3 = function_name(local_198);
      uVar4 = value_create_function(local_198);
      local_4e4 = scope_define(lVar1,uVar3,uVar4);
      local_4e8 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
                 in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748,
                 (int *)in_stack_fffffffffffff740);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4e0);
      if (!bVar2) {
        testing::Message::Message(&local_4f0);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e8d3);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0x11d,pcVar7);
        testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
        testing::internal::AssertHelper::~AssertHelper(&local_4f8);
        testing::Message::~Message((Message *)0x10e930);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e985);
    }
    local_500 = 0;
    local_528 = scope_metadata(local_78);
    local_520 = 0;
    local_508 = local_528;
    testing::internal::CmpHelperNE<void*,void*>
              ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
               in_stack_fffffffffffff750,in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_518);
    if (!bVar2) {
      testing::Message::Message(&local_530);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10ea5a);
      testing::internal::AssertHelper::AssertHelper
                (&local_538,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0x125,pcVar7);
      testing::internal::AssertHelper::operator=(&local_538,&local_530);
      testing::internal::AssertHelper::~AssertHelper(&local_538);
      testing::Message::~Message((Message *)0x10eab7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10eb0f);
    local_540 = memory_allocator_std(malloc,realloc,free);
    local_548 = serial_serialize(local_70,local_508,&local_500,local_540);
    log_write_impl_va("metacall",299,"TestBody",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                      ,0,"Scope serialization info: %s",local_548);
    memory_allocator_deallocate(local_540,local_548);
    memory_allocator_destroy(local_540);
    value_type_destroy(local_508);
    type_destroy(local_b0);
    type_destroy(local_b8);
    type_destroy(local_c0);
    scope_destroy(local_78);
  }
  local_55c = 0;
  local_560 = serial_clear(local_70);
  this_00 = &local_558;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758),
             &this_00->success_,(int *)in_stack_fffffffffffff748,(int *)in_stack_fffffffffffff740);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar2) {
    testing::Message::Message(&local_568);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10ecaf);
    testing::internal::AssertHelper::AssertHelper
              (&local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x13c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_570,&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_570);
    testing::Message::~Message((Message *)0x10ed0c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ed61);
  serial_destroy();
  return;
}

Assistant:

TEST_F(reflect_scope_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	// Initialize serial
	EXPECT_EQ((int)0, (int)serial_initialize());

	// Create serial
	serial s = serial_create("rapid_json");

	scope sp = scope_create("test");

	EXPECT_NE((scope)sp, (scope)NULL);

	type char_type = type_create(TYPE_CHAR, "char", NULL, NULL);
	type int_type = type_create(TYPE_INT, "int", NULL, NULL);
	type ptr_type = type_create(TYPE_PTR, "ptr", NULL, NULL);

	EXPECT_NE((type)char_type, (type)NULL);
	EXPECT_NE((type)int_type, (type)NULL);
	EXPECT_NE((type)ptr_type, (type)NULL);

	if (sp && char_type != NULL && int_type != NULL && ptr_type != NULL)
	{
		function f1, f2, f3, f4, f5, f6, f7, f8, f9;

		function_impl_example example_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f1 = function_create("example", 3, example_impl, &function_example_singleton);

		EXPECT_NE((function)f1, (function)NULL);

		if (f1 != NULL)
		{
			signature_set(function_signature(f1), 0, "c", char_type);
			signature_set(function_signature(f1), 1, "i", int_type);
			signature_set(function_signature(f1), 2, "p", ptr_type);

			EXPECT_EQ((int)scope_define(sp, function_name(f1), value_create_function(f1)), (int)0);
		}

		function_impl_example example_asd_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f2 = function_create("example_asd", 3, example_asd_impl, &function_example_singleton);

		EXPECT_NE((function)f2, (function)NULL);

		if (f2 != NULL)
		{
			signature_set(function_signature(f2), 0, "e", char_type);
			signature_set(function_signature(f2), 1, "o", int_type);
			signature_set(function_signature(f2), 2, "u", ptr_type);

			EXPECT_EQ((int)scope_define(sp, function_name(f2), value_create_function(f2)), (int)0);
		}

		function_impl_example example_ret_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f3 = function_create("example_ret", 3, example_ret_impl, &function_example_singleton);

		EXPECT_NE((function)f3, (function)NULL);

		if (f3 != NULL)
		{
			signature_set_return(function_signature(f3), int_type);
			signature_set(function_signature(f3), 0, "e", char_type);
			signature_set(function_signature(f3), 1, "o", int_type);
			signature_set(function_signature(f3), 2, "u", ptr_type);

			EXPECT_EQ((int)scope_define(sp, function_name(f3), value_create_function(f3)), (int)0);
		}

		function_impl_example example_duck_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f4 = function_create("example_duck", 3, example_duck_impl, &function_example_singleton);

		EXPECT_NE((function)f4, (function)NULL);

		if (f4 != NULL)
		{
			signature_set(function_signature(f4), 0, "e", NULL);
			signature_set(function_signature(f4), 1, "o", NULL);
			signature_set(function_signature(f4), 2, "u", NULL);

			EXPECT_EQ((int)scope_define(sp, function_name(f4), value_create_function(f4)), (int)0);
		}

		function_impl_example example_duck_ret_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f5 = function_create("example_duck_ret", 3, example_duck_ret_impl, &function_example_singleton);

		EXPECT_NE((function)f5, (function)NULL);

		if (f5 != NULL)
		{
			signature_set_return(function_signature(f5), int_type);
			signature_set(function_signature(f5), 0, "asdfe", NULL);
			signature_set(function_signature(f5), 1, "do", NULL);
			signature_set(function_signature(f5), 2, "dafu", NULL);

			EXPECT_EQ((int)scope_define(sp, function_name(f5), value_create_function(f5)), (int)0);
		}

		function_impl_example example_duck_mix_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f6 = function_create("example_duck_mix", 4, example_duck_mix_impl, &function_example_singleton);

		EXPECT_NE((function)f6, (function)NULL);

		if (f6 != NULL)
		{
			signature_set(function_signature(f6), 0, "asdfe", NULL);
			signature_set(function_signature(f6), 1, "do", int_type);
			signature_set(function_signature(f6), 2, "dafu", NULL);
			signature_set(function_signature(f6), 3, "dafu", ptr_type);

			EXPECT_EQ((int)scope_define(sp, function_name(f6), value_create_function(f6)), (int)0);
		}

		function_impl_example example_duck_mix_ret_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f7 = function_create("example_duck_mix_ret", 4, example_duck_mix_ret_impl, &function_example_singleton);

		EXPECT_NE((function)f7, (function)NULL);

		if (f7 != NULL)
		{
			signature_set_return(function_signature(f7), int_type);
			signature_set(function_signature(f7), 0, "asdfe", int_type);
			signature_set(function_signature(f7), 1, "do", NULL);
			signature_set(function_signature(f7), 2, "dafu", ptr_type);
			signature_set(function_signature(f7), 3, "dafufs", NULL);

			EXPECT_EQ((int)scope_define(sp, function_name(f7), value_create_function(f7)), (int)0);
		}

		function_impl_example example_empty_ret_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f8 = function_create("example_empty_ret", 0, example_empty_ret_impl, &function_example_singleton);

		EXPECT_NE((function)f8, (function)NULL);

		if (f8 != NULL)
		{
			signature_set_return(function_signature(f8), int_type);

			EXPECT_EQ((int)scope_define(sp, function_name(f8), value_create_function(f8)), (int)0);
		}

		function_impl_example example_empty_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f9 = function_create("example_empty", 0, example_empty_impl, &function_example_singleton);

		EXPECT_NE((function)f9, (function)NULL);

		if (f9 != NULL)
		{
			EXPECT_EQ((int)scope_define(sp, function_name(f9), value_create_function(f9)), (int)0);
		}

		{
			size_t size = 0;

			value v = scope_metadata(sp);

			EXPECT_NE((value)NULL, (value)v);

			memory_allocator allocator = memory_allocator_std(&std::malloc, &std::realloc, &std::free);

			char *str = serial_serialize(s, v, &size, allocator);

			log_write("metacall", LOG_LEVEL_DEBUG, "Scope serialization info: %s", str);

			memory_allocator_deallocate(allocator, str);

			memory_allocator_destroy(allocator);

			value_type_destroy(v);
		}

		type_destroy(char_type);
		type_destroy(int_type);
		type_destroy(ptr_type);

		scope_destroy(sp);
	}

	// Clear serial
	EXPECT_EQ((int)0, (int)serial_clear(s));

	// Destroy serial
	serial_destroy();
}